

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O0

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoQuad>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoQuad>_> *this,TPZVec<long> *nodeindices,
          int matind,TPZGeoMesh *mesh)

{
  TPZVec<long> *in_RCX;
  undefined4 in_EDX;
  TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZGeoMesh *mesh_00;
  double *val;
  undefined4 in_stack_ffffffffffffffe8;
  
  val = (double *)0x0;
  mesh_00 = (TPZGeoMesh *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoQuad>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024c8be8);
  TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
            (in_RSI,(void **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,
             (int)((ulong)val >> 0x20),mesh_00);
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c88a0;
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c88a0;
  TPZFNMatrix<8,_double>::TPZFNMatrix
            ((TPZFNMatrix<8,_double> *)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int64_t)in_RCX,val);
  return;
}

Assistant:

TPZGeoElMapped(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
	TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(nodeindices,matind,mesh), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}